

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O2

ssize_t AbstractFileBuffer::read(int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ByteBuffer *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  long lVar5;
  long lVar6;
  FileBufferException *this_00;
  undefined4 in_register_0000003c;
  long *plVar7;
  long lVar8;
  QString local_90;
  CustomException anon_var_0;
  
  plVar7 = (long *)CONCAT44(in_register_0000003c,__fd);
  pvVar3 = (void *)(**(code **)(*plVar7 + 0x80))();
  if (__buf < pvVar3) {
    __buf = pvVar3;
  }
  this = (ByteBuffer *)operator_new(0x28);
  ByteBuffer::ByteBuffer(this,(bufsize_t)__buf,2);
  iVar1 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[3])(this);
  iVar2 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[2])(this);
  if ((CONCAT44(extraout_var,iVar1) == 0) || (CONCAT44(extraout_var_00,iVar2) == 0)) {
    this_00 = (FileBufferException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_90,"Cannot allocate buffer");
    FileBufferException::FileBufferException(this_00,&local_90);
    __cxa_throw(this_00,&FileBufferException::typeinfo,CustomException::~CustomException);
  }
  lVar8 = 0;
  lVar6 = 0;
  while (uVar4 = (**(code **)(*plVar7 + 0x78))(plVar7), uVar4 < CONCAT44(extraout_var_00,iVar2) - 1U
        ) {
    lVar5 = QIODevice::read((char *)plVar7,CONCAT44(extraout_var,iVar1) + lVar8);
    lVar8 = lVar8 + lVar5;
    lVar5 = (**(code **)(*plVar7 + 0x78))(plVar7);
    if (lVar6 == lVar5) break;
    lVar6 = (**(code **)(*plVar7 + 0x78))(plVar7);
  }
  Logger::append(D_INFO,"Read size: %lX",lVar8);
  return (ssize_t)this;
}

Assistant:

ByteBuffer* AbstractFileBuffer::read(QFile &fIn, bufsize_t minBufSize, const bool allowTruncate) //throws exceptions
{
    bufsize_t readableSize = getReadableSize(fIn);
    bufsize_t allocSize = (readableSize < minBufSize) ? minBufSize : readableSize;

    ByteBuffer *bufferedFile = NULL;
    do {
        try {
            bufferedFile = new ByteBuffer(allocSize); //throws exceptions
        }
        catch (CustomException)
        {
            if (!allowTruncate) throw;
            allocSize /= 2;
        }
    } while(!bufferedFile && allocSize);

    char *content = (char*) bufferedFile->getContent();
    bufsize_t contentSize = bufferedFile->getContentSize();

    if (!content || !contentSize) throw FileBufferException("Cannot allocate buffer");
    //printf("Reading...%lx , BUFSIZE_MAX = %lx\n", allocSize, BUFSIZE_MAX);

    bufsize_t readSize = 0;
    offset_t prevOffset = 0;
    offset_t maxOffset = contentSize - 1;

    while (offset_t(fIn.pos()) < maxOffset) {

        bufsize_t maxSize = contentSize - readSize;
        if (maxSize > FILEVIEW_MAXSIZE) maxSize = FILEVIEW_MAXSIZE;

        readSize += fIn.read(content + readSize,  maxSize);
        if (prevOffset == fIn.pos()) break; //cannot read more!
        prevOffset = fIn.pos();
    }
    Logger::append(Logger::D_INFO,
        "Read size: %lX",
        static_cast<unsigned long>(readSize)
    );
    return bufferedFile;
}